

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O0

void __thiscall
cmExportInstallFileGenerator::ComplainAboutMissingTarget
          (cmExportInstallFileGenerator *this,cmGeneratorTarget *depender,
          cmGeneratorTarget *dependee,int occurrences)

{
  ostream *poVar1;
  cmExportSet *this_00;
  string *psVar2;
  string local_1d0;
  undefined1 local_1a0 [8];
  ostringstream e;
  int occurrences_local;
  cmGeneratorTarget *dependee_local;
  cmGeneratorTarget *depender_local;
  cmExportInstallFileGenerator *this_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  poVar1 = std::operator<<((ostream *)local_1a0,"install(EXPORT \"");
  this_00 = cmInstallExportGenerator::GetExportSet(this->IEGen);
  psVar2 = cmExportSet::GetName_abi_cxx11_(this_00);
  poVar1 = std::operator<<(poVar1,(string *)psVar2);
  poVar1 = std::operator<<(poVar1,"\" ...) ");
  poVar1 = std::operator<<(poVar1,"includes target \"");
  psVar2 = cmGeneratorTarget::GetName_abi_cxx11_(depender);
  poVar1 = std::operator<<(poVar1,(string *)psVar2);
  poVar1 = std::operator<<(poVar1,"\" which requires target \"");
  psVar2 = cmGeneratorTarget::GetName_abi_cxx11_(dependee);
  poVar1 = std::operator<<(poVar1,(string *)psVar2);
  std::operator<<(poVar1,"\" ");
  if (occurrences == 0) {
    std::operator<<((ostream *)local_1a0,"that is not in the export set.");
  }
  else {
    poVar1 = std::operator<<((ostream *)local_1a0,"that is not in this export set, but ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,occurrences);
    std::operator<<(poVar1," times in others.");
  }
  std::__cxx11::ostringstream::str();
  cmSystemTools::Error(&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  return;
}

Assistant:

void cmExportInstallFileGenerator::ComplainAboutMissingTarget(
  cmGeneratorTarget* depender, cmGeneratorTarget* dependee, int occurrences)
{
  std::ostringstream e;
  e << "install(EXPORT \"" << this->IEGen->GetExportSet()->GetName()
    << "\" ...) "
    << "includes target \"" << depender->GetName()
    << "\" which requires target \"" << dependee->GetName() << "\" ";
  if (occurrences == 0) {
    e << "that is not in the export set.";
  } else {
    e << "that is not in this export set, but " << occurrences
      << " times in others.";
  }
  cmSystemTools::Error(e.str());
}